

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_thread.cpp
# Opt level: O2

void __thiscall
rw_executor<booster::recursive_shared_mutex>::operator()
          (rw_executor<booster::recursive_shared_mutex> *this)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = 0x14;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    if (this->read == true) {
      booster::recursive_shared_mutex::shared_lock();
      std::mutex::lock(this->flags_mutex);
      *this->flag = true;
      pthread_mutex_unlock((pthread_mutex_t *)this->flags_mutex);
      booster::ptime::millisleep(5);
      std::mutex::lock(this->flags_mutex);
      *this->flag = false;
      pthread_mutex_unlock((pthread_mutex_t *)this->flags_mutex);
    }
    else {
      booster::recursive_shared_mutex::unique_lock();
      *this->flag = true;
      booster::ptime::millisleep(5);
      *this->flag = false;
    }
    booster::recursive_shared_mutex::unlock();
  }
  return;
}

Assistant:

void operator()() const
	{
		for(int i=0;i<20;i++) {
			if(read) {
				mutex->shared_lock();
				{
					flags_mutex->lock();
					*flag = true;
					flags_mutex->unlock();
				}
				booster::ptime::millisleep(5);
				{
					flags_mutex->lock();
					*flag = false;
					flags_mutex->unlock();
				}
				mutex->unlock();
			}
			else {
				mutex->unique_lock();
				*flag = true;
				booster::ptime::millisleep(5);
				*flag = false;
				mutex->unlock();
			}
		}
	}